

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utBlendImportAreaLight.cpp
# Opt level: O1

void __thiscall
BlendImportAreaLight_testImportLight_Test::TestBody(BlendImportAreaLight_testImportLight_Test *this)

{
  pointer *pppVar1;
  vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
  vVar2;
  pointer ppVar3;
  pointer ppVar4;
  aiScene *paVar5;
  ulong uVar6;
  char *pcVar7;
  char *in_R9;
  long lVar8;
  bool bVar9;
  bool bVar10;
  AssertionResult gtest_ar;
  vector<aiLight,_std::allocator<aiLight>_> lights;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  lightNames;
  AssertHelper local_98;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_48;
  
  paVar5 = Assimp::Importer::ReadFile
                     ((this->super_BlendImportAreaLight).im,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/BLEND/AreaLight_269.blend"
                      ,0x400);
  pppVar1 = &local_48.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  vVar2 = (vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
           )(paVar5 != (aiScene *)0x0);
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = vVar2;
  if (paVar5 == (aiScene *)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78.first,(internal *)&local_48,(AssertionResult *)"pTest != NULL","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
               ,0x49,local_78.first._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p);
    }
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar9 = testing::internal::IsTrue(true);
      if ((bVar9) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)pppVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)pppVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar9 = paVar5->mLights != (aiLight **)0x0;
    bVar10 = paVar5->mNumLights != 0;
    pppVar1 = &local_48.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_48.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar10 && bVar9);
    local_48.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar10 && bVar9) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pppVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (paVar5->mNumLights != 0) {
        uVar6 = 0;
        do {
          std::__cxx11::string::string
                    ((string *)&local_78,(paVar5->mLights[uVar6]->mName).data,(allocator *)&local_88
                    );
          local_78.second = uVar6;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
          ::emplace_back<std::pair<std::__cxx11::string,unsigned_long>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
                      *)&local_48,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
            operator_delete(local_78.first._M_dataplus._M_p);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < paVar5->mNumLights);
      }
      ppVar4 = local_48.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = local_48.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_48.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar6 = ((long)local_48.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        lVar8 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_48.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_48.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar3,ppVar4);
      }
      local_78.first._M_dataplus._M_p = (pointer)0x0;
      local_78.first._M_string_length = 0;
      local_78.first.field_2._M_allocated_capacity = 0;
      if (paVar5->mNumLights != 0) {
        lVar8 = 0x20;
        uVar6 = 0;
        do {
          std::vector<aiLight,_std::allocator<aiLight>_>::push_back
                    ((vector<aiLight,_std::allocator<aiLight>_> *)&local_78,
                     paVar5->mLights
                     [*(long *)((long)&((local_48.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first).
                                       _M_dataplus._M_p + lVar8)]);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x28;
        } while (uVar6 < paVar5->mNumLights);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_88,"lights[0].mName.C_Str()","\"Bar\"",
                 local_78.first._M_dataplus._M_p + 4,"Bar");
      if (local_88.ptr_._0_1_ == (allocator)0x0) {
        testing::Message::Message((Message *)&local_98);
        if (local_80.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                   ,0x5a,pcVar7);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_98.data_ != (AssertHelperData *)0x0) {
          bVar9 = testing::internal::IsTrue(true);
          if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_98.data_ + 8))();
          }
          local_98.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_88,"lights[1].mName.C_Str()","\"Baz\"",
                   local_78.first._M_dataplus._M_p + 0x470,"Baz");
        if (local_88.ptr_._0_1_ == (allocator)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                     ,0x5b,pcVar7);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if (local_98.data_ != (AssertHelperData *)0x0) {
            bVar9 = testing::internal::IsTrue(true);
            if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_98.data_ + 8))();
            }
            local_98.data_ = (AssertHelperData *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_88,"lights[2].mName.C_Str()","\"Foo\"",
                     local_78.first._M_dataplus._M_p + 0x8dc,"Foo");
          if (local_88.ptr_._0_1_ == (allocator)0x0) {
            testing::Message::Message((Message *)&local_98);
            if (local_80.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                       ,0x5c,pcVar7);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            if (local_98.data_ != (AssertHelperData *)0x0) {
              bVar9 = testing::internal::IsTrue(true);
              if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_98.data_ + 8))();
              }
              local_98.data_ = (AssertHelperData *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_98.data_._0_4_ = 5;
            testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                      ((internal *)&local_88,"lights[0].mType","aiLightSource_AREA",
                       (aiLightSourceType *)(local_78.first._M_dataplus._M_p + 0x404),
                       (aiLightSourceType *)&local_98);
            if (local_88.ptr_._0_1_ == (allocator)0x0) {
              testing::Message::Message((Message *)&local_98);
              if (local_80.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_90,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                         ,0x5e,pcVar7);
              testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
              testing::internal::AssertHelper::~AssertHelper(&local_90);
              if (local_98.data_ != (AssertHelperData *)0x0) {
                bVar9 = testing::internal::IsTrue(true);
                if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_98.data_ + 8))();
                }
                local_98.data_ = (AssertHelperData *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_80,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_80,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_98.data_._0_4_ = 2;
              testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                        ((internal *)&local_88,"lights[1].mType","aiLightSource_POINT",
                         (aiLightSourceType *)(local_78.first._M_dataplus._M_p + 0x870),
                         (aiLightSourceType *)&local_98);
              if (local_88.ptr_._0_1_ == (allocator)0x0) {
                testing::Message::Message((Message *)&local_98);
                if (local_80.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x5f,pcVar7);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                if (local_98.data_ != (AssertHelperData *)0x0) {
                  bVar9 = testing::internal::IsTrue(true);
                  if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_98.data_ + 8))();
                  }
                  local_98.data_ = (AssertHelperData *)0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_80,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_80,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                local_98.data_._0_4_ = 5;
                testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                          ((internal *)&local_88,"lights[2].mType","aiLightSource_AREA",
                           (aiLightSourceType *)(local_78.first._M_dataplus._M_p + 0xcdc),
                           (aiLightSourceType *)&local_98);
                if (local_88.ptr_._0_1_ == (allocator)0x0) {
                  testing::Message::Message((Message *)&local_98);
                  if (local_80.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                             ,0x60,pcVar7);
                  testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                  testing::internal::AssertHelper::~AssertHelper(&local_90);
                  if (local_98.data_ != (AssertHelperData *)0x0) {
                    bVar9 = testing::internal::IsTrue(true);
                    if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                      (**(code **)(*(long *)local_98.data_ + 8))();
                    }
                    local_98.data_ = (AssertHelperData *)0x0;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mSize.x","0.5f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x464),0.5);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x62,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mSize.y","2.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x468),2.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,99,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mSize.x","1.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xd3c),1.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,100,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mSize.y","1.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xd40),1.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x65,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mColorDiffuse.r","42.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x438),42.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x67,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mColorDiffuse.g","42.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x43c),42.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x68,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mColorDiffuse.b","42.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x440),42.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x69,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mColorDiffuse.r","1.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xd10),1.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6a,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mColorDiffuse.g","1.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xd14),1.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6b,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mColorDiffuse.b","1.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xd18),1.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6c,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mDirection.x","0.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x414),0.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6e,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mDirection.y","0.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x418),0.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6f,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[0].mDirection.z","-1.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0x41c),-1.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x70,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mDirection.x","0.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xcec),0.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x71,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mDirection.y","0.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xcf0),0.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x72,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)&local_88,"lights[2].mDirection.z","-1.0f",
                             *(float *)(local_78.first._M_dataplus._M_p + 0xcf4),-1.0);
                  if (local_88.ptr_._0_1_ == (allocator)0x0) {
                    testing::Message::Message((Message *)&local_98);
                    if (local_80.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = ((local_80.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x73,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if (local_98.data_ != (AssertHelperData *)0x0) {
                      bVar9 = testing::internal::IsTrue(true);
                      if ((bVar9) && (local_98.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_98.data_ + 8))();
                      }
                      local_98.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
              }
            }
          }
        }
      }
      if (local_78.first._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_78.first._M_dataplus._M_p);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~vector(&local_48);
    }
    else {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_78.first,(internal *)&local_48,(AssertionResult *)"pTest->HasLights()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                 ,0x4a,local_78.first._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
        operator_delete(local_78.first._M_dataplus._M_p);
      }
      if (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar9 = testing::internal::IsTrue(true);
        if ((bVar9) &&
           (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_88.ptr_ + 8))();
        }
        local_88.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pppVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST_F(BlendImportAreaLight, testImportLight)
{
    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/BLEND/AreaLight_269.blend", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest != NULL);
    ASSERT_TRUE(pTest->HasLights());

    std::vector< std::pair<std::string, size_t> > lightNames;

    for (size_t i = 0; i < pTest->mNumLights; i++) {
        lightNames.push_back(std::make_pair(pTest->mLights[i]->mName.C_Str(), i));
    }

    std::sort(lightNames.begin(), lightNames.end());

    std::vector<aiLight> lights;

    for (size_t i = 0; i < pTest->mNumLights; ++i) {
        lights.push_back(*pTest->mLights[lightNames[i].second]);
    }

    ASSERT_STREQ(lights[0].mName.C_Str(), "Bar");
    ASSERT_STREQ(lights[1].mName.C_Str(), "Baz");
    ASSERT_STREQ(lights[2].mName.C_Str(), "Foo");

    ASSERT_EQ(lights[0].mType, aiLightSource_AREA);
    ASSERT_EQ(lights[1].mType, aiLightSource_POINT);
    ASSERT_EQ(lights[2].mType, aiLightSource_AREA);

    EXPECT_FLOAT_EQ(lights[0].mSize.x, 0.5f);
    EXPECT_FLOAT_EQ(lights[0].mSize.y, 2.0f);
    EXPECT_FLOAT_EQ(lights[2].mSize.x, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mSize.y, 1.0f);

    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.r, 42.0f);
    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.g, 42.0f);
    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.b, 42.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.r, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.g, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.b, 1.0f);

    EXPECT_FLOAT_EQ(lights[0].mDirection.x, 0.0f);
    EXPECT_FLOAT_EQ(lights[0].mDirection.y, 0.0f);
    EXPECT_FLOAT_EQ(lights[0].mDirection.z, -1.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.x, 0.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.y, 0.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.z, -1.0f);
}